

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O3

void Fra_BmcPerformSimple(Aig_Man_t *pAig,int nFrames,int nBTLimit,int fRewrite,int fVerbose)

{
  int iVar1;
  int *pModel;
  void *__ptr;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Fra_Bmc_t *pFVar6;
  Aig_Man_t *pAVar7;
  Aig_Man_t *pAVar8;
  Abc_Cex_t *pAVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  timespec ts;
  timespec local_60;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  Fra_Bmc_t *local_40;
  Fra_Man_t *local_38;
  
  local_44 = nBTLimit;
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  pFVar6 = Fra_BmcStart(pAig,0,nFrames);
  local_38 = Fra_LcrAigPrepare(pAig);
  local_38->pBmc = pFVar6;
  pAVar7 = Fra_BmcFrames(pFVar6,1);
  pFVar6->pAigFrames = pAVar7;
  local_40 = pFVar6;
  if (fVerbose != 0) {
    uVar5 = pAig->nRegs;
    iVar2 = pAig->nObjs[2];
    iVar14 = pAig->nObjs[3];
    iVar13 = pAig->nObjs[6];
    iVar1 = pAig->nObjs[5];
    local_50 = nFrames;
    local_4c = fRewrite;
    local_48 = fVerbose;
    uVar3 = Aig_ManLevelNum(pAig);
    printf("AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)(iVar2 - uVar5),
           (ulong)(iVar14 - uVar5),(ulong)uVar5,(ulong)(uint)(iVar13 + iVar1),(ulong)uVar3);
    pAVar7 = local_40->pAigFrames;
    uVar5 = pAVar7->nObjs[2];
    uVar3 = pAVar7->nObjs[3];
    iVar2 = pAVar7->nObjs[6];
    iVar14 = pAVar7->nObjs[5];
    uVar4 = Aig_ManLevelNum(pAVar7);
    iVar13 = 0x8ecdd2;
    printf("Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ",(ulong)local_50,
           (ulong)uVar5,(ulong)uVar3,(ulong)(uint)(iVar2 + iVar14),(ulong)uVar4);
    Abc_Print(iVar13,"%s =","Time");
    iVar14 = 3;
    iVar2 = clock_gettime(3,&local_60);
    if (iVar2 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar11 + lVar10) / 1000000.0);
    fRewrite = local_4c;
    fVerbose = local_48;
  }
  pFVar6 = local_40;
  if (fRewrite != 0) {
    iVar2 = clock_gettime(3,&local_60);
    if (iVar2 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
      lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_60.tv_sec * -1000000;
    }
    pAVar7 = pFVar6->pAigFrames;
    pAVar8 = Dar_ManRwsat(pAVar7,1,0);
    pFVar6->pAigFrames = pAVar8;
    Aig_ManStop(pAVar7);
    if (fVerbose != 0) {
      pAVar7 = pFVar6->pAigFrames;
      iVar2 = pAVar7->nObjs[6];
      iVar14 = pAVar7->nObjs[5];
      uVar5 = Aig_ManLevelNum(pAVar7);
      iVar13 = 0x8ece0e;
      printf("Time-frames after rewriting:  Node = %6d. Lev = %5d.  ",(ulong)(uint)(iVar2 + iVar14),
             (ulong)uVar5);
      Abc_Print(iVar13,"%s =","Time");
      iVar14 = 3;
      iVar2 = clock_gettime(3,&local_60);
      if (iVar2 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar11 + lVar10) / 1000000.0);
    }
  }
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  iVar2 = Fra_FraigMiterAssertedOutput(pFVar6->pAigFrames);
  if (iVar2 < 0) {
    pAVar7 = Fra_FraigEquivence(pFVar6->pAigFrames,local_44,1);
    pFVar6->pAigFraig = pAVar7;
    iVar2 = Fra_FraigMiterAssertedOutput(pAVar7);
    pModel = (int *)pFVar6->pAigFraig->pData;
    if (pModel != (int *)0x0) {
      pAVar9 = Fra_SmlCopyCounterExample(pAig,pFVar6->pAigFrames,pModel);
      pAig->pSeqModel = pAVar9;
      __ptr = pFVar6->pAigFraig->pData;
      if (__ptr != (void *)0x0) {
        free(__ptr);
        pFVar6->pAigFraig->pData = (void *)0x0;
      }
      goto LAB_005c786a;
    }
    if (iVar2 < 0) goto LAB_005c786a;
  }
  iVar14 = pAig->nRegs;
  pAVar9 = Abc_CexMakeTriv(iVar14,pAig->nObjs[2] - iVar14,pAig->nObjs[3] - iVar14,iVar2);
  pAig->pSeqModel = pAVar9;
LAB_005c786a:
  if (fVerbose != 0) {
    pAVar7 = pFVar6->pAigFraig;
    if (pAVar7 == (Aig_Man_t *)0x0) {
      uVar5 = 0xffffffff;
      uVar12 = 0xffffffff;
    }
    else {
      uVar5 = pAVar7->nObjs[6] + pAVar7->nObjs[5];
      uVar3 = Aig_ManLevelNum(pAVar7);
      uVar12 = (ulong)uVar3;
    }
    iVar2 = 0x90d984;
    printf("Fraiged init frames: Node = %6d. Lev = %5d.  ",(ulong)uVar5,uVar12);
    Abc_Print(iVar2,"%s =","Time");
    iVar14 = 3;
    iVar2 = clock_gettime(3,&local_60);
    if (iVar2 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar11 + lVar10) / 1000000.0);
  }
  Fra_BmcStop(pFVar6);
  free(local_38);
  return;
}

Assistant:

void Fra_BmcPerformSimple( Aig_Man_t * pAig, int nFrames, int nBTLimit, int fRewrite, int fVerbose )
{
    extern Fra_Man_t * Fra_LcrAigPrepare( Aig_Man_t * pAig );
    Fra_Man_t * pTemp;
    Fra_Bmc_t * pBmc;
    Aig_Man_t * pAigTemp;
    abctime clk;
    int iOutput;
    // derive and fraig the frames
    clk = Abc_Clock();
    pBmc = Fra_BmcStart( pAig, 0, nFrames );
    pTemp = Fra_LcrAigPrepare( pAig );
    pTemp->pBmc = pBmc;
    pBmc->pAigFrames = Fra_BmcFrames( pBmc, 1 );
    if ( fVerbose )
    {
        printf( "AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig), Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig), Aig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ", 
            nFrames, Aig_ManCiNum(pBmc->pAigFrames), Aig_ManCoNum(pBmc->pAigFrames), 
            Aig_ManNodeNum(pBmc->pAigFrames), Aig_ManLevelNum(pBmc->pAigFrames) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    if ( fRewrite )
    {
        clk = Abc_Clock();
        pBmc->pAigFrames = Dar_ManRwsat( pAigTemp = pBmc->pAigFrames, 1, 0 );
        Aig_ManStop( pAigTemp );
        if ( fVerbose )
        {
            printf( "Time-frames after rewriting:  Node = %6d. Lev = %5d.  ", 
                Aig_ManNodeNum(pBmc->pAigFrames), Aig_ManLevelNum(pBmc->pAigFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    clk = Abc_Clock();
    iOutput = Fra_FraigMiterAssertedOutput( pBmc->pAigFrames );
    if ( iOutput >= 0 )
        pAig->pSeqModel = Abc_CexMakeTriv( Aig_ManRegNum(pAig), Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig), Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig), iOutput );
    else
    {
        pBmc->pAigFraig = Fra_FraigEquivence( pBmc->pAigFrames, nBTLimit, 1 );
        iOutput = Fra_FraigMiterAssertedOutput( pBmc->pAigFraig );
        if ( pBmc->pAigFraig->pData )
        {
            pAig->pSeqModel = Fra_SmlCopyCounterExample( pAig, pBmc->pAigFrames, (int *)pBmc->pAigFraig->pData );
            ABC_FREE( pBmc->pAigFraig->pData );
        }
        else if ( iOutput >= 0 )
            pAig->pSeqModel = Abc_CexMakeTriv( Aig_ManRegNum(pAig), Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig), Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig), iOutput );
    }
    if ( fVerbose )
    {
        printf( "Fraiged init frames: Node = %6d. Lev = %5d.  ", 
            pBmc->pAigFraig? Aig_ManNodeNum(pBmc->pAigFraig) : -1,
            pBmc->pAigFraig? Aig_ManLevelNum(pBmc->pAigFraig) : -1 );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Fra_BmcStop( pBmc );  
    ABC_FREE( pTemp );
}